

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
* __thiscall
ThreadContext::FindPropertyIdNoCase
          (ThreadContext *this,ScriptContext *scriptContext,CharacterBuffer<char16_t> *propertyName)

{
  CaseInvariantPropertyListWithHashCode **ppCVar1;
  BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *this_00;
  
  this_00 = (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
             *)this->caseInvariantPropertySet;
  if (this_00 ==
      (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
       *)0x0) {
    CreateNoCasePropertyMap(this);
    this_00 = (BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
               *)this->caseInvariantPropertySet;
  }
  ppCVar1 = JsUtil::
            BaseHashSet<Js::CaseInvariantPropertyListWithHashCode*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::CaseInvariantPropertyListWithHashCode*,JsUtil::NoCaseComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::LookupWithKey<JsUtil::CharacterBuffer<char16_t>>(this_00,propertyName);
  return &(*ppCVar1)->
          super_List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ;
}

Assistant:

JsUtil::List<const RecyclerWeakReference<Js::PropertyRecord const>*>*
ThreadContext::FindPropertyIdNoCase(Js::ScriptContext * scriptContext, JsUtil::CharacterBuffer<WCHAR> const& propertyName)
{
    if (caseInvariantPropertySet == nullptr)
    {
        this->CreateNoCasePropertyMap();
    }
    Js::CaseInvariantPropertyListWithHashCode* list;
    if (FindExistingPropertyRecord(propertyName, &list))
    {
        return list;
    }
    return nullptr;
}